

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O2

void google::protobuf::compiler::java::anon_unknown_4::SetEnumVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  int field_number;
  java *this;
  uint32 uVar1;
  FieldType type;
  EnumDescriptor *pEVar2;
  mapped_type *pmVar3;
  EnumValueDescriptor *pEVar4;
  protobuf *this_00;
  int i;
  int i_00;
  int bitIndex;
  int bitIndex_00;
  int bitIndex_01;
  int bitIndex_02;
  int bitIndex_03;
  int bitIndex_04;
  unsigned_long i_01;
  key_type *this_01;
  string *this_02;
  key_type kStack_f8;
  string local_d8;
  allocator<char> local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  key_type local_90;
  key_type local_70;
  key_type local_50;
  
  this_02 = &kStack_f8;
  this = (java *)(ulong)(uint)messageBitIndex;
  SetCommonFieldVariables(descriptor,info,variables);
  pEVar2 = FieldDescriptor::enum_type(descriptor);
  ClassNameResolver::GetImmutableClassName<google::protobuf::EnumDescriptor>
            (&local_d8,name_resolver,pEVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_f8,"type",(allocator<char> *)&local_b0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_f8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&kStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  pEVar2 = FieldDescriptor::enum_type(descriptor);
  ClassNameResolver::GetMutableClassName<google::protobuf::EnumDescriptor>
            (&local_d8,name_resolver,pEVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_f8,"mutable_type",(allocator<char> *)&local_b0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_f8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&kStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  ImmutableDefaultValue_abi_cxx11_
            (&local_d8,(java *)descriptor,(FieldDescriptor *)name_resolver,(ClassNameResolver *)info
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_f8,"default",(allocator<char> *)&local_b0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_f8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&kStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  pEVar4 = FieldDescriptor::default_value_enum(descriptor);
  SimpleItoa_abi_cxx11_(&local_d8,(protobuf *)(ulong)*(uint *)(pEVar4 + 0x10),i);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_f8,"default_number",(allocator<char> *)&local_b0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_f8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&kStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  uVar1 = internal::WireFormat::MakeTag(descriptor);
  SimpleItoa_abi_cxx11_(&local_d8,(protobuf *)(ulong)uVar1,i_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_f8,"tag",(allocator<char> *)&local_b0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_f8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&kStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  field_number = *(int *)(descriptor + 0x38);
  type = GetType(descriptor);
  this_00 = (protobuf *)internal::WireFormatLite::TagSize(field_number,type);
  SimpleItoa_abi_cxx11_(&local_d8,this_00,i_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_f8,"tag_size",(allocator<char> *)&local_b0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_f8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&kStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"deprecation",(allocator<char> *)&kStack_f8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_d8);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"required",(allocator<char> *)&kStack_f8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_d8);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&local_d8);
  if (*(int *)(*(long *)(descriptor + 0x30) + 0x8c) == 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"set_has_field_bit_message",(allocator<char> *)&kStack_f8);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_d8);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"clear_has_field_bit_message",(allocator<char> *)&kStack_f8);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_d8);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"name",&local_b1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_90);
    std::operator+(&local_b0,pmVar3,"_ != ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"default",&local_b2);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_70);
    std::operator+(&kStack_f8,&local_b0,pmVar3);
    std::operator+(&local_d8,&kStack_f8,".getNumber()");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"is_field_present_message",&local_b3);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_50);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&kStack_f8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    this_01 = &local_90;
  }
  else {
    GenerateGetBit_abi_cxx11_(&local_d8,this,bitIndex);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_f8,"get_has_field_bit_message",(allocator<char> *)&local_b0);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&kStack_f8);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&kStack_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    GenerateSetBit_abi_cxx11_(&kStack_f8,this,bitIndex_00);
    std::operator+(&local_d8,&kStack_f8,";");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"set_has_field_bit_message",(allocator<char> *)&local_90);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_b0);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&kStack_f8);
    GenerateClearBit_abi_cxx11_(&kStack_f8,this,bitIndex_01);
    std::operator+(&local_d8,&kStack_f8,";");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"clear_has_field_bit_message",(allocator<char> *)&local_90);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_b0);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&kStack_f8);
    GenerateGetBit_abi_cxx11_(&local_d8,this,bitIndex_02);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_f8,"is_field_present_message",(allocator<char> *)&local_b0);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&kStack_f8);
    this_01 = &local_d8;
    std::__cxx11::string::operator=((string *)pmVar3,(string *)this_01);
    std::__cxx11::string::~string((string *)&kStack_f8);
  }
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_f8,"name",(allocator<char> *)&local_90);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_f8);
  std::operator+(&local_d8,pmVar3,"_.isModifiable()");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"is_mutable",(allocator<char> *)&local_70);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_b0);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&kStack_f8);
  GenerateGetBitFromLocal_abi_cxx11_(&local_d8,(java *)(ulong)(uint)builderBitIndex,bitIndex_03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_f8,"get_has_field_bit_from_local",(allocator<char> *)&local_b0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_f8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&kStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  GenerateSetBitToLocal_abi_cxx11_(&local_d8,this,bitIndex_04);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_f8,"set_has_field_bit_to_local",(allocator<char> *)&local_b0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_f8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&kStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (*(int *)(*(long *)(descriptor + 0x30) + 0x8c) == 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_f8,"type",(allocator<char> *)&local_90);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&kStack_f8);
    std::operator+(&local_d8,pmVar3,".UNRECOGNIZED");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"unknown",(allocator<char> *)&local_70);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_b0);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"default",(allocator<char> *)&local_b0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](variables,&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_f8,"unknown",(allocator<char> *)&local_90);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&kStack_f8);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)&kStack_f8);
    this_02 = &local_d8;
  }
  std::__cxx11::string::~string((string *)this_02);
  return;
}

Assistant:

void SetEnumVariables(const FieldDescriptor* descriptor,
                      int messageBitIndex,
                      int builderBitIndex,
                      const FieldGeneratorInfo* info,
                      ClassNameResolver* name_resolver,
                      std::map<string, string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);

  (*variables)["type"] =
      name_resolver->GetImmutableClassName(descriptor->enum_type());
  (*variables)["mutable_type"] =
      name_resolver->GetMutableClassName(descriptor->enum_type());
  (*variables)["default"] = ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["default_number"] = SimpleItoa(
      descriptor->default_value_enum()->number());
  (*variables)["tag"] =
      SimpleItoa(static_cast<int32>(internal::WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = SimpleItoa(
      internal::WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] = descriptor->options().deprecated()
      ? "@java.lang.Deprecated " : "";
  (*variables)["required"] = descriptor->is_required() ? "true" : "false";

  if (SupportFieldPresence(descriptor->file())) {
    // For singular messages and builders, one bit is used for the hasField bit.
    (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);

    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        GenerateSetBit(messageBitIndex) + ";";
    (*variables)["clear_has_field_bit_message"] =
        GenerateClearBit(messageBitIndex) + ";";

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["clear_has_field_bit_message"] = "";

    (*variables)["is_field_present_message"] =
        (*variables)["name"] + "_ != " +
        (*variables)["default"] + ".getNumber()";
  }

  // For repeated builders, the underlying list tracks mutability state.
  (*variables)["is_mutable"] = (*variables)["name"] + "_.isModifiable()";

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);

  if (SupportUnknownEnumValue(descriptor->file())) {
    (*variables)["unknown"] = (*variables)["type"] + ".UNRECOGNIZED";
  } else {
    (*variables)["unknown"] = (*variables)["default"];
  }
}